

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_kvtree_exchange.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  uint local_20;
  int local_1c;
  int ranks;
  int rank;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _ranks = argv;
  argv_local._0_4_ = argc;
  MPI_Init(&argv_local,&ranks);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_1c);
  MPI_Comm_size(&ompi_mpi_comm_world,&local_20);
  if (local_20 == 3) {
    iVar1 = exchange(0,local_1c,3);
    if (iVar1 == 1) {
      argv_local._4_4_ = 1;
    }
    else {
      iVar1 = exchange(1,local_1c,local_20);
      if (iVar1 == 1) {
        argv_local._4_4_ = 1;
      }
      else {
        iVar1 = exchange(-1,local_1c,local_20);
        if (iVar1 == 1) {
          argv_local._4_4_ = 1;
        }
        else {
          MPI_Finalize();
          argv_local._4_4_ = 0;
        }
      }
    }
  }
  else {
    printf("test_kvtree_exchange, tests require 3 processes; actual # is %d\n",(ulong)local_20);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv){
  int rank,ranks;
  MPI_Init(&argc, &argv);
  MPI_Comm_rank(MPI_COMM_WORLD, &rank);
  MPI_Comm_size(MPI_COMM_WORLD, &ranks);
  if( ranks != 3){
    printf("test_kvtree_exchange, tests require 3 processes; actual # is %d\n", ranks);
    return TEST_FAIL;
  }
  //call sraight kvtree_exchange
  if(exchange(0, rank, ranks) == TEST_FAIL) return TEST_FAIL;
  //call kvtree_exchange_direction RIGHT
  if(exchange(1, rank, ranks) == TEST_FAIL) return TEST_FAIL;
  //call kvtree_exchange_direction LEFT
  if(exchange(-1, rank, ranks) == TEST_FAIL) return TEST_FAIL;

  MPI_Finalize();
  return TEST_PASS;
}